

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCreateFromGias(char *pName,Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  void **ppvVar7;
  Abc_Ntk_t *pNtk;
  char *pcVar8;
  long lVar9;
  Abc_Obj_t *pAVar10;
  Vec_Int_t *pVVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  Gia_Obj_t *pGVar17;
  Gia_Man_t *pGVar18;
  
  pGVar18 = pMulti;
  if (pMulti == (Gia_Man_t *)0x0) {
    if (vGias->nSize < 1) {
LAB_00875888:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pGVar18 = (Gia_Man_t *)*vGias->pArray;
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar8 = Extra_UtilStrsav(pName);
  pNtk->pName = pcVar8;
  if (0 < pGVar18->vCis->nSize) {
    iVar15 = 0;
    do {
      Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      iVar15 = iVar15 + 1;
    } while (iVar15 < pGVar18->vCis->nSize);
  }
  if (pMulti == (Gia_Man_t *)0x0) {
    if (0 < vGias->nSize) {
      lVar9 = 0;
      do {
        pGVar18 = (Gia_Man_t *)vGias->pArray[lVar9];
        if (pGVar18->vCos->nSize != 1) {
          __assert_fail("Gia_ManCoNum(pGia) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                        ,0x8f4,"Abc_Ntk_t *Abc_NtkCreateFromGias(char *, Vec_Ptr_t *, Gia_Man_t *)")
          ;
        }
        Gia_ManCleanValue(pGVar18);
        lVar13 = (long)pGVar18->vCis->nSize;
        if (0 < lVar13) {
          piVar5 = pGVar18->vCis->pArray;
          lVar14 = 0;
          do {
            iVar15 = piVar5[lVar14];
            if (((long)iVar15 < 0) || (pGVar18->nObjs <= iVar15)) goto LAB_00875869;
            if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
            if (pNtk->vCis->nSize <= lVar14) goto LAB_00875888;
            pGVar18->pObjs[iVar15].Value = *(uint *)((long)pNtk->vCis->pArray[lVar14] + 0x10);
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
        }
        iVar15 = pGVar18->nObjs;
        if ((0 < iVar15) && (pGVar17 = pGVar18->pObjs, pGVar17 != (Gia_Obj_t *)0x0)) {
          lVar13 = 0;
          do {
            uVar6 = *(ulong *)pGVar17;
            if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
              uVar3 = pGVar17[-(uVar6 & 0x1fffffff)].Value;
              if ((long)(int)uVar3 < 0) goto LAB_00875888;
              iVar15 = pNtk->vObjs->nSize;
              if (iVar15 <= (int)uVar3) goto LAB_00875888;
              uVar16 = (uint)(uVar6 >> 0x20);
              uVar4 = pGVar17[-(ulong)(uVar16 & 0x1fffffff)].Value;
              if (((long)(int)uVar4 < 0) || (iVar15 <= (int)uVar4)) goto LAB_00875888;
              ppvVar7 = pNtk->vObjs->pArray;
              pAVar10 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                                   (Abc_Obj_t *)
                                   ((ulong)((uint)(uVar6 >> 0x1d) & 1) ^ (ulong)ppvVar7[(int)uVar3])
                                   ,(Abc_Obj_t *)
                                    ((ulong)(uVar16 >> 0x1d & 1) ^ (ulong)ppvVar7[(int)uVar4]));
              pGVar17->Value = pAVar10->Id;
            }
            lVar13 = lVar13 + 1;
            iVar15 = pGVar18->nObjs;
          } while ((lVar13 < iVar15) &&
                  (pGVar17 = pGVar18->pObjs + lVar13, pGVar18->pObjs != (Gia_Obj_t *)0x0));
        }
        if (pGVar18->vCos->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = *pGVar18->vCos->pArray;
        if (((long)(int)uVar3 < 0) || (iVar15 <= (int)uVar3)) goto LAB_00875869;
        pGVar17 = pGVar18->pObjs + (int)uVar3;
        if (uVar3 == ((uint)*(undefined8 *)pGVar17 & 0x1fffffff)) {
          pAVar10 = Abc_AigConst1(pNtk);
          pvVar12 = (void *)((ulong)pAVar10 ^ 1);
        }
        else {
          uVar3 = pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value;
          if (((long)(int)uVar3 < 0) || (pNtk->vObjs->nSize <= (int)uVar3)) goto LAB_00875888;
          pvVar12 = pNtk->vObjs->pArray[(int)uVar3];
        }
        uVar3 = *(uint *)pGVar17;
        pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar10,(Abc_Obj_t *)((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)pvVar12));
        lVar9 = lVar9 + 1;
      } while (lVar9 < vGias->nSize);
    }
  }
  else {
    Gia_ManCleanValue(pGVar18);
    lVar9 = (long)pGVar18->vCis->nSize;
    if (0 < lVar9) {
      piVar5 = pGVar18->vCis->pArray;
      lVar13 = 0;
      do {
        iVar15 = piVar5[lVar13];
        if (((long)iVar15 < 0) || (pGVar18->nObjs <= iVar15)) goto LAB_00875869;
        if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
        if (pNtk->vCis->nSize <= lVar13) goto LAB_00875888;
        pGVar18->pObjs[iVar15].Value = *(uint *)((long)pNtk->vCis->pArray[lVar13] + 0x10);
        lVar13 = lVar13 + 1;
      } while (lVar9 != lVar13);
    }
    if (0 < pGVar18->nObjs) {
      lVar13 = 8;
      lVar9 = 0;
      do {
        pGVar17 = pGVar18->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        uVar6 = *(ulong *)((long)pGVar17 + lVar13 + -8);
        if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
          iVar15 = *(int *)((long)pGVar17 +
                           lVar13 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3);
          if ((long)iVar15 < 0) goto LAB_00875888;
          iVar1 = pNtk->vObjs->nSize;
          if (iVar1 <= iVar15) goto LAB_00875888;
          iVar2 = *(int *)((long)pGVar17 + lVar13 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3
                          );
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_00875888;
          ppvVar7 = pNtk->vObjs->pArray;
          pAVar10 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                               (Abc_Obj_t *)
                               ((ulong)((uint)(uVar6 >> 0x1d) & 1) ^ (ulong)ppvVar7[iVar15]),
                               (Abc_Obj_t *)
                               ((ulong)((uint)(uVar6 >> 0x3d) & 1) ^ (ulong)ppvVar7[iVar2]));
          *(int *)(&pGVar17->field_0x0 + lVar13) = pAVar10->Id;
        }
        lVar9 = lVar9 + 1;
        lVar13 = lVar13 + 0xc;
      } while (lVar9 < pGVar18->nObjs);
    }
    pVVar11 = pGVar18->vCos;
    if (0 < pVVar11->nSize) {
      lVar9 = 0;
      do {
        uVar3 = pVVar11->pArray[lVar9];
        if (((long)(int)uVar3 < 0) || (pGVar18->nObjs <= (int)uVar3)) {
LAB_00875869:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar17 = pGVar18->pObjs + (int)uVar3;
        if (uVar3 == ((uint)*(undefined8 *)pGVar17 & 0x1fffffff)) {
          pAVar10 = Abc_AigConst1(pNtk);
          pvVar12 = (void *)((ulong)pAVar10 ^ 1);
        }
        else {
          uVar3 = pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value;
          if (((long)(int)uVar3 < 0) || (pNtk->vObjs->nSize <= (int)uVar3)) goto LAB_00875888;
          pvVar12 = pNtk->vObjs->pArray[(int)uVar3];
        }
        uVar3 = *(uint *)pGVar17;
        pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar10,(Abc_Obj_t *)((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)pvVar12));
        lVar9 = lVar9 + 1;
        pVVar11 = pGVar18->vCos;
      } while (lVar9 < pVVar11->nSize);
    }
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateFromGias( char * pName, Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Gia_Man_t * pGia = pMulti ? pMulti : (Gia_Man_t *)Vec_PtrEntry(vGias, 0);
    Abc_Ntk_t * pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    Abc_Obj_t * pAbcObj, * pAbcObjPo;
    Gia_Obj_t * pObj; int i, k;
    pNtk->pName = Extra_UtilStrsav( pName );
    for ( k = 0; k < Gia_ManCiNum(pGia); k++ )
        Abc_NtkCreatePi( pNtk );
    if ( pMulti )
    {
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        Gia_ManForEachCo( pGia, pObj, k )
        {
            //pObj = Gia_ManCo(pGia, 0);
            if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
                pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
            else
                pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
            pAbcObjPo = Abc_NtkCreatePo( pNtk );
            Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
        }
    }
    else
    {
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pGia, i )
    {
        assert( Gia_ManCoNum(pGia) == 1 );
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        pObj = Gia_ManCo(pGia, 0);
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
        else
            pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
        pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
        pAbcObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
    }
    }
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    return pNtk;
}